

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

int __thiscall chrono::ChSystemDescriptor::CountActiveVariables(ChSystemDescriptor *this)

{
  int *piVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  ChVariables *pCVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (this->freeze_count != true) {
    ppCVar2 = (this->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppCVar3 = (this->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    piVar1 = &this->n_q;
    this->n_q = 0;
    lVar7 = (long)ppCVar3 - (long)ppCVar2;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 3;
      lVar6 = 0;
      do {
        pCVar4 = (this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar6];
        if (pCVar4->disabled == false) {
          pCVar4->offset = *piVar1;
          iVar5 = (*pCVar4->_vptr_ChVariables[2])();
          *piVar1 = *piVar1 + iVar5;
        }
        lVar6 = lVar6 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar6);
    }
  }
  return this->n_q;
}

Assistant:

int ChSystemDescriptor::CountActiveVariables() {
    if (freeze_count)  // optimization, avoid list count all times
        return n_q;
    
    auto vv_size = vvariables.size();

    n_q = 0;
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->SetOffset(n_q);  // also store offsets in state and MC matrix
            n_q += vvariables[iv]->Get_ndof();
        }
    }
    return n_q;
}